

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void pshufw_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined8 uVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar1 == '\x02') {
      uVar2 = 0x7768667568737076;
LAB_00120e78:
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar2;
      (pMyDisasm->Instruction).Mnemonic[8] = '\0';
LAB_00120e83:
      vex_GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        UVar1 = (pMyDisasm->Reserved_).EVEX.vvvv;
      }
      else {
        UVar1 = (pMyDisasm->Reserved_).VEX.vvvv;
      }
      if (UVar1 != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
    }
    else {
      if (UVar1 == '\x01') {
        if (((pMyDisasm->Reserved_).EVEX.state != '\x01') ||
           ((pMyDisasm->Reserved_).EVEX.W != '\x01')) {
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpshufd",8);
          goto LAB_00120e83;
        }
      }
      else if (UVar1 != '\0') {
        uVar2 = 0x776c667568737076;
        goto LAB_00120e78;
      }
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    }
    return;
  }
  (pMyDisasm->Instruction).Category = 0x50017;
  if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    (pMyDisasm->Prefix).RepPrefix = '\b';
    uVar2 = 0x77686675687370;
LAB_00120db7:
    *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar2;
  }
  else {
    if ((pMyDisasm->Reserved_).PrefRepne == 1) {
      (pMyDisasm->Prefix).RepnePrefix = '\b';
      uVar2 = 0x776c6675687370;
      goto LAB_00120db7;
    }
    if ((pMyDisasm->Prefix).OperandSize != '\x01') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pshufw",7);
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Reserved_).Register_ = 2;
      goto LAB_00120dcf;
    }
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pshufd",7);
  }
  (pMyDisasm->Reserved_).MemDecoration = 0x6d;
  (pMyDisasm->Reserved_).Register_ = 4;
LAB_00120dcf:
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ pshufw_(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 1) {
     if (
         (GV.EVEX.state == InUsePrefix) &&
         (GV.EVEX.W == 1)
       ) {
       failDecode(pMyDisasm);
       return;
     }
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpshufd");
     #endif
     vex_GxEx(pMyDisasm);
     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
     verifyVEXvvvv(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpshufhw");
     #endif
     vex_GxEx(pMyDisasm);
     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
     verifyVEXvvvv(pMyDisasm);
   }
   else {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpshuflw");
     #endif
     vex_GxEx(pMyDisasm);
     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
     verifyVEXvvvv(pMyDisasm);
   }
 }
 else {
   pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+SIMD128bits;
   /* ========= 0xf3 */
   if (GV.PrefRepe == 1) {
     pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshufhw");
     #endif
     GV.MemDecoration = Arg2_m128_xmm;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
   /* ========= 0xf2 */
   else if (GV.PrefRepne == 1) {
     pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshuflw");
     #endif
     GV.MemDecoration = Arg2_m128_xmm;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     GV.OperandSize = GV.OriginalOperandSize;
     pMyDisasm->Prefix.OperandSize = MandatoryPrefix;

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshufd");
     #endif
     GV.MemDecoration = Arg2_m128_xmm;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
   else {

     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pshufw");
     #endif
     GV.MemDecoration = Arg2qword;
     GV.Register_ = MMX_REG;
     GxEx(pMyDisasm);

     getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
 }
}